

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O3

void CheckStackTrace(int i)

{
  int j;
  bool bVar1;
  
  expected_range[5].start = (void *)0x108944;
  expected_range[5].end = (void *)0x108954;
  if (-1 < i) {
    do {
      CheckStackTrace1(i);
      bVar1 = i != 0;
      i = i + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ATTRIBUTE_NOINLINE
    CheckStackTrace(int i) {
  INIT_ADDRESS_RANGE(CheckStackTrace, start, end, &expected_range[5]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace1(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}